

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::CustomExternalWrapperObject::HasItemQuery(CustomExternalWrapperObject *this,uint32 index)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  Var aValue;
  JavascriptBoolean *pJVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  PropertyQueryFlags PVar8;
  Attributes attributes;
  HostScriptContext *pHVar9;
  JavascriptFunction *function;
  uint64 uVar10;
  uint64 uVar11;
  undefined4 *puVar12;
  JavascriptMethod p_Var13;
  RecyclableObject *ptr;
  double value;
  ulong local_40;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  pHVar9 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar9->scriptContext;
  BVar7 = EnsureInitialized(this,pSVar2);
  if (BVar7 == 0) {
    return Property_NotFound;
  }
  aValue = *(Var *)&((this->super_DynamicObject).super_RecyclableObject.type.ptr[1].propertyCache.
                    ptr)->elements[2].field_0x8;
  if (aValue == (Var)0x0) {
    function = (JavascriptFunction *)0x0;
  }
  else {
    function = VarTo<Js::JavascriptFunction>(aValue);
  }
  if ((function == (JavascriptFunction *)0x0) ||
     (bVar5 = Memory::Recycler::IsHeapEnumInProgress(pSVar2->recycler), bVar5)) {
    PVar8 = DynamicObject::HasItemQuery(&this->super_DynamicObject,index);
    return (uint)(PVar8 == Property_Found);
  }
  pJVar3 = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           booleanTrue.ptr;
  if ((int)index < 0) {
    value = (double)index;
    uVar10 = NumberUtilities::ToSpecial(value);
    bVar5 = NumberUtilities::IsNan(value);
    if (((bVar5) && (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0xfff8000000000000)) &&
       (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0x7ff8000000000000)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                  ,0xa2,
                                  "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                  ,"We should only produce a NaN with this value");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar12 = 0;
    }
    local_40 = uVar10 ^ 0xfffc000000000000;
  }
  else {
    local_40 = (ulong)index | 0x1000000000000;
  }
  bVar5 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar6 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar6) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var13);
    p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var13)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,
                     this,0,pJVar3,local_40);
    bVar6 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
      goto LAB_00b41f86;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var13);
      p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var13)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,
                       this,0,pJVar3,local_40);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00b41f86;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var13);
    p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var13)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,
                     this,0,pJVar3,local_40);
    bVar6 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar6 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00b41f86:
  this_00->reentrancySafeOrHandled = bVar5;
  BVar7 = JavascriptConversion::ToBoolean(ptr,pSVar2);
  return (uint)(BVar7 != 0);
}

Assistant:

Js::PropertyQueryFlags CustomExternalWrapperObject::HasItemQuery(uint32 index)
{
    auto fn = [&](Js::RecyclableObject* object)-> BOOL {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasItemQuery(index));
    };

    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        *isPropertyNameNumeric = requestContext->GetLibrary()->GetTrue();
        *propertyNameNumericValue = JavascriptNumber::ToVar(index, requestContext);
        return nullptr;
    };

    return Js::JavascriptConversion::BooleanToPropertyQueryFlags(HasPropertyTrap(fn, getPropertyName, nullptr));
}